

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int epoll_update(int op,filter *filt,knote *kn,int ev,_Bool delete)

{
  undefined8 uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  uint in_ECX;
  undefined8 *in_RDX;
  long in_RSI;
  int in_EDI;
  byte in_R8B;
  knote *unaff_retaddr;
  undefined4 in_stack_00000008;
  int del;
  int add;
  int kn_ev;
  fd_state **in_stack_00000018;
  int to_delete_1;
  int to_delete;
  int fd;
  int opn;
  int want_ev;
  int want;
  int have_ev;
  fd_state *fds;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar8;
  int local_38;
  uint local_30;
  undefined4 in_stack_fffffffffffffffc;
  _Bool disabled;
  
  disabled = SUB41((uint)in_stack_fffffffffffffffc >> 0x18,0);
  bVar2 = in_R8B & 1;
  uVar1 = *in_RDX;
  uVar3 = epoll_fd_state((fd_state **)CONCAT44(del,in_stack_00000008),unaff_retaddr,disabled);
  if (in_EDI == 1) {
    local_30 = uVar3 | in_ECX;
  }
  else if (in_EDI == 2) {
    local_30 = uVar3 & (in_ECX ^ 0xffffffff);
    if ((bVar2 != 0) &&
       (uVar4 = epoll_fd_state((fd_state **)CONCAT44(del,in_stack_00000008),unaff_retaddr,disabled),
       (in_ECX & 5 & uVar4) != 0)) {
      epoll_fd_state_del((fd_state **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (knote *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4);
    }
  }
  else {
    if (in_EDI != 3) {
      return -1;
    }
    local_30 = in_ECX;
    if ((bVar2 != 0) &&
       (uVar4 = epoll_fd_state((fd_state **)CONCAT44(del,in_stack_00000008),unaff_retaddr,disabled),
       ((in_ECX ^ 0xffffffff) & uVar4) != 0)) {
      epoll_fd_state_del((fd_state **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (knote *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4);
    }
  }
  uVar4 = local_30 & 5;
  if ((uVar3 == 0) && (uVar4 != 0)) {
    local_38 = 1;
    epoll_fd_state_mod(in_stack_00000018,_add,del);
  }
  else if ((uVar3 == 0) || (uVar4 != 0)) {
    if (uVar3 == uVar4) {
      return 0;
    }
    local_38 = 3;
  }
  else {
    local_38 = 2;
  }
  uVar8 = 0x38;
  iVar5 = epoll_ctl(*(int *)(*(long *)(in_RSI + 0x98) + 0x7c0),local_38,(int)uVar1,
                    (epoll_event *)&stack0xffffffffffffffb0);
  if (iVar5 < 0) {
    if (local_38 == 1) {
      epoll_fd_state_del((fd_state **)CONCAT44(uVar8,local_30),
                         (knote *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4);
    }
    else if ((local_38 - 2U < 2) && (piVar7 = __errno_location(), *piVar7 == 9)) {
      uVar3 = 0;
      if (in_RDX == puRam0000000000000028) {
        uVar3 = 1;
      }
      else if (in_RDX == puRam0000000000000030) {
        uVar3 = 4;
      }
      uVar3 = (uVar4 ^ 0xffffffff) & uVar3;
      if (uVar3 != 0) {
        epoll_fd_state_del((fd_state **)CONCAT44(uVar8,local_30),
                           (knote *)CONCAT44(uVar3,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa4);
        return 0;
      }
    }
    iVar5 = -1;
  }
  else {
    if (local_38 == 2) {
      if (bVar2 != 0) {
        epoll_fd_state_del((fd_state **)CONCAT44(uVar8,local_30),
                           (knote *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa4);
      }
    }
    else if (local_38 == 3) {
      uVar6 = uVar4 & (uVar3 ^ 0xffffffff);
      uVar3 = uVar3 & (uVar4 ^ 0xffffffff);
      if (uVar6 != 0) {
        epoll_fd_state_mod(in_stack_00000018,_add,del);
      }
      if ((uVar3 != 0) && (bVar2 != 0)) {
        epoll_fd_state_del((fd_state **)CONCAT44(uVar8,local_30),
                           (knote *)CONCAT44(in_stack_ffffffffffffffac,uVar6),uVar3);
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
epoll_update(int op, struct filter *filt, struct knote *kn, int ev, bool delete)
{
    struct fd_state *fds = NULL;
    int have_ev, want, want_ev;
    int opn;
    int fd;

    fd = kn->kev.ident;

#define EV_EPOLLINOUT(_x) ((_x) & (EPOLLIN | EPOLLOUT))

    if (KNOTE_DISABLED(kn)) dbg_printf("fd=%i kn=%p is disabled", fd, kn);
    if (KNOTE_IS_EOF(kn)) dbg_printf("fd=%i kn=%p is EOF", fd, kn);

    /*
     * Determine the current state of the file descriptor
     * and see if we need to make changes.
     */
    have_ev = epoll_fd_state(&fds, kn, false);            /* ...enabled only */

    dbg_printf("fd=%i have_ev=0x%04x (%s)", fd, have_ev, epoll_flags_dump(have_ev));
    switch (op) {
    case EPOLL_CTL_ADD:
        want = have_ev | ev;            /* This also preserves other option flags */
        break;

    case EPOLL_CTL_DEL:
        want = have_ev & ~ev;           /* No options for delete */

        /*
         * If we're performing a delete we need
         * to check for previously disabled
         * knotes that may now be being deleted.
         */
        if (delete) {
            int to_delete;

            to_delete = epoll_fd_state(&fds, kn, true); /* ...disabled only */
            dbg_printf("fd=%i disabled_ev=0x%04x (%s)", fd, to_delete, epoll_flags_dump(to_delete));
            to_delete &= EV_EPOLLINOUT(ev);

            if (to_delete) {
                dbg_printf("fd=%i ev=%i removing disabled fd state", fd, op);
                epoll_fd_state_del(&fds, kn, to_delete);
            }
        }
        break;

    case EPOLL_CTL_MOD:
        want = ev;                   /* We assume the caller knows what its doing... */

        if (delete) {
            int to_delete;

            to_delete = epoll_fd_state(&fds, kn, true); /* ...disabled only */
            dbg_printf("fd=%i disabled_ev=0x%04x (%s)", fd, to_delete, epoll_flags_dump(to_delete));
            to_delete &= ~ev;

            if (to_delete) {
                dbg_printf("fd=%i ev=%i removing disabled fd state", fd, op);
                epoll_fd_state_del(&fds, kn, to_delete);
            }
        }
        break;

    default:
        assert(0);
        return (-1);
    }

    /*
     * We only want the read/write flags for comparisons.
     */
    want_ev = EV_EPOLLINOUT(want);
     if (!have_ev && want_ev) {        /* There's no events registered and we want some */
        opn = EPOLL_CTL_ADD;
        epoll_fd_state_mod(&fds, kn, want_ev & ~have_ev);
    }
    else if (have_ev && !want_ev)       /* We have events registered but don't want any */
        opn = EPOLL_CTL_DEL;
    else if (have_ev != want_ev)        /* There's events but they're not what we want */
        opn = EPOLL_CTL_MOD;
    else
        return (0);

    dbg_printf("fd=%i op=0x%04x (%s) opn=0x%04x (%s) %s",
               fd,
               op, epoll_op_dump(op),
               opn, epoll_op_dump(opn),
               epoll_event_dump(EPOLL_EV_FDS(want, fds)));

    if (epoll_ctl(filter_epoll_fd(filt), opn, fd, EPOLL_EV_FDS(want, fds)) < 0) {
        dbg_printf("epoll_ctl(2): %s", strerror(errno));

        switch (opn) {
        case EPOLL_CTL_ADD:
            epoll_fd_state_del(&fds, kn, want_ev & ~have_ev);
            break;

        case EPOLL_CTL_DEL:
        case EPOLL_CTL_MOD:
            /*
             * File descriptor went away and we weren't notified
             * not necessarily an error.
             */
            if (errno == EBADF) {
                int kn_ev = 0;

                if (kn == fds->fds_read) {
                    kn_ev = EPOLLIN;
                } else if (kn == fds->fds_write) {
                    kn_ev = EPOLLOUT;
                }
                kn_ev &= ~want_ev;    /* If it wasn't wanted... */

                if (kn_ev) {
                    dbg_printf("clearing fd=%i fds=%p ev=%s", fd, fds, epoll_flags_dump(kn_ev));
                    epoll_fd_state_del(&fds, kn, kn_ev);
                    return (0);
                }
            }
            break;
        }

        return (-1);
    }

    /*
     * Only change fd state for del and mod on success
     * we need to 'add' before so that we get the fd_state
     * structure to pass in to epoll.
     */
    switch (opn) {
    case EPOLL_CTL_DEL:
        if (delete) {
            dbg_printf("fd=%i ev=%i removing fd state", fd, op);
            epoll_fd_state_del(&fds, kn, have_ev & ~want_ev);      /* We rely on the caller to mark the knote as disabled */
        }
        break;

    case EPOLL_CTL_MOD:
    {
        int add, del;

        add = want_ev & ~have_ev;
        del = have_ev & ~want_ev;

        if (add) epoll_fd_state_mod(&fds, kn, add);
        if (del && delete) {
            dbg_printf("fd=%i ev=%i removing fd state", fd, op);
            epoll_fd_state_del(&fds, kn, del);                 /* We rely on the caller to mark the knote as disabled */
        }
    }
        break;
    }

    return (0);
}